

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O0

void __thiscall Privkey_FromWif_wif_error_Test::TestBody(Privkey_FromWif_wif_error_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_d8;
  AssertHelper local_b8;
  Message local_b0;
  bool local_a1;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  CfdException *cfd_except;
  Privkey privkey;
  allocator local_31;
  undefined1 local_30 [8];
  string wif;
  Privkey_FromWif_wif_error_Test *this_local;
  
  wif.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"91xDetrgFxon9rHyPGKg5U5Kjttn6JGiGZc",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::Privkey::FromWif((Privkey *)&cfd_except,(string *)local_30,kTestnet,true);
  cfd::core::Privkey::~Privkey((Privkey *)&cfd_except);
  std::__cxx11::string::~string((string *)local_30);
  local_a1 = false;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a0,&local_a1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)local_a0,(AssertionResult *)0x6a1824,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0xaf,message);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  return;
}

Assistant:

TEST(Privkey, FromWif_wif_error) {
  try {
    std::string wif = "91xDetrgFxon9rHyPGKg5U5Kjttn6JGiGZc";
    Privkey privkey = Privkey::FromWif(wif, NetType::kTestnet);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "Error WIF to Private key.");
    return;
  }
  ASSERT_TRUE(false);
}